

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.h
# Opt level: O0

void stats_clear(stats_t *stats)

{
  stats_t *stats_local;
  
  stats->_n = 0;
  stats->_mean = 0.0;
  stats->_M2 = 0.0;
  stats->_sum = 0.0;
  stats->_min = 0.0;
  stats->_max = 0.0;
  return;
}

Assistant:

static inline void stats_clear(stats_t *stats) {
    stats->_n = 0UL;
    stats->_mean = 0.0;
    stats->_M2 = 0.0;
    stats->_sum = 0.0;
    stats->_min = 0.0;
    stats->_max = 0.0;
}